

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O2

uint64_t aom_sum_squares_2d_i16_nxn_sse2(int16_t *src,int stride,int width,int height)

{
  int c;
  long lVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  long lVar4;
  long lVar5;
  int iVar8;
  int iVar9;
  undefined1 auVar6 [16];
  int iVar10;
  undefined1 auVar7 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  iVar2 = 0;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar1 = 0;
    auVar6 = (undefined1  [16])0x0;
    pauVar3 = (undefined1 (*) [16])src;
    do {
      auVar11 = pmaddwd(*pauVar3,*pauVar3);
      iVar8 = auVar6._4_4_;
      iVar9 = auVar6._8_4_;
      iVar10 = auVar6._12_4_;
      auVar12 = pmaddwd(*(undefined1 (*) [16])(*pauVar3 + (long)stride * 2),
                        *(undefined1 (*) [16])(*pauVar3 + (long)stride * 2));
      auVar13 = pmaddwd(*(undefined1 (*) [16])(*pauVar3 + (long)(stride * 2) * 2),
                        *(undefined1 (*) [16])(*pauVar3 + (long)(stride * 2) * 2));
      auVar7 = pmaddwd(*(undefined1 (*) [16])(*pauVar3 + (long)(stride * 3) * 2),
                       *(undefined1 (*) [16])(*pauVar3 + (long)(stride * 3) * 2));
      auVar6._0_4_ = auVar7._0_4_ + auVar13._0_4_ + auVar12._0_4_ + auVar11._0_4_ + auVar6._0_4_;
      auVar6._4_4_ = auVar7._4_4_ + auVar13._4_4_ + auVar12._4_4_ + auVar11._4_4_ + iVar8;
      auVar6._8_4_ = auVar7._8_4_ + auVar13._8_4_ + auVar12._8_4_ + auVar11._8_4_ + iVar9;
      auVar6._12_4_ = auVar7._12_4_ + auVar13._12_4_ + auVar12._12_4_ + auVar11._12_4_ + iVar10;
      lVar1 = lVar1 + 8;
      pauVar3 = pauVar3 + 1;
    } while (lVar1 < width);
    lVar4 = lVar4 + (ulong)auVar6._4_4_ + SUB168(auVar6 & _DAT_0046d920,0);
    lVar5 = lVar5 + (auVar6._8_8_ >> 0x20) + SUB168(auVar6 & _DAT_0046d920,8);
    iVar2 = iVar2 + 4;
    src = (int16_t *)(*(undefined1 (*) [16])src + (long)(stride * 4) * 2);
  } while (iVar2 < height);
  return lVar5 + lVar4;
}

Assistant:

__attribute__((noinline))
#endif
uint64_t
aom_sum_squares_2d_i16_nxn_sse2(const int16_t *src, int stride, int width,
                                int height) {
  int r = 0;

  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc_q = _mm_setzero_si128();

  do {
    __m128i v_acc_d = _mm_setzero_si128();
    int c = 0;
    do {
      const int16_t *b = src + c;

      const __m128i v_val_0_w = xx_load_128(b + 0 * stride);
      const __m128i v_val_1_w = xx_load_128(b + 1 * stride);
      const __m128i v_val_2_w = xx_load_128(b + 2 * stride);
      const __m128i v_val_3_w = xx_load_128(b + 3 * stride);

      const __m128i v_sq_0_d = _mm_madd_epi16(v_val_0_w, v_val_0_w);
      const __m128i v_sq_1_d = _mm_madd_epi16(v_val_1_w, v_val_1_w);
      const __m128i v_sq_2_d = _mm_madd_epi16(v_val_2_w, v_val_2_w);
      const __m128i v_sq_3_d = _mm_madd_epi16(v_val_3_w, v_val_3_w);

      const __m128i v_sum_01_d = _mm_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m128i v_sum_23_d = _mm_add_epi32(v_sq_2_d, v_sq_3_d);

      const __m128i v_sum_0123_d = _mm_add_epi32(v_sum_01_d, v_sum_23_d);

      v_acc_d = _mm_add_epi32(v_acc_d, v_sum_0123_d);
      c += 8;
    } while (c < width);

    v_acc_q = _mm_add_epi64(v_acc_q, _mm_and_si128(v_acc_d, v_zext_mask_q));
    v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_epi64(v_acc_d, 32));

    src += 4 * stride;
    r += 4;
  } while (r < height);

  v_acc_q = _mm_add_epi64(v_acc_q, _mm_srli_si128(v_acc_q, 8));
  return xx_cvtsi128_si64(v_acc_q);
}